

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O2

void WriteDDintoBLIFfile(FILE *pFile,DdNode *Func,char *OutputName,char *Prefix,char **InputNames)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  FILE *pFVar3;
  int iVar4;
  st__table *visited;
  st__generator *psVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  DdNode *Node;
  FILE *local_60;
  char *local_58;
  st__generator *local_50;
  st__table *local_48;
  char **local_40;
  int *pSlot;
  
  local_60 = (FILE *)pFile;
  local_58 = Prefix;
  local_50 = (st__generator *)OutputName;
  local_40 = InputNames;
  visited = st__init_table(st__ptrcmp,st__ptrhash);
  cuddCollectNodes((DdNode *)((ulong)Func & 0xfffffffffffffffe),visited);
  local_48 = visited;
  psVar5 = st__init_gen(visited);
  uVar8 = 0;
  while (iVar4 = st__gen(psVar5,(char **)&Node,(char **)0x0), iVar4 != 0) {
    uVar8 = uVar8 | (ulong)Node ^ (ulong)Func & 0xfffffffffffffffe;
  }
  st__free_gen(psVar5);
  pFVar3 = local_60;
  uVar6 = 0;
  do {
    if (0x3f < uVar6) break;
    visited = (st__table *)(ulong)(uint)~(-1 << ((byte)uVar6 & 0x1f));
    uVar6 = uVar6 + 4;
  } while ((long)visited < (long)uVar8);
  fprintf(local_60,".names %s%lx %s\n",local_58,((ulong)visited & (ulong)Func) / 0x28,local_50);
  pcVar7 = "0";
  if (((ulong)Func & 1) == 0) {
    pcVar7 = "1";
  }
  fprintf(pFVar3,"%s 1\n",pcVar7);
  local_50 = st__init_gen(local_48);
  psVar5 = local_50;
  while( true ) {
    while( true ) {
      iVar4 = st__gen(psVar5,(char **)&Node,(char **)0x0);
      pFVar3 = local_60;
      if (iVar4 == 0) {
        st__free_gen(psVar5);
        st__free_table(local_48);
        return;
      }
      if ((ulong)Node->index != 0x7fffffff) break;
      fprintf(local_60,".names %s%lx\n",local_58,((ulong)Node & (ulong)visited) / 0x28);
      pcVar7 = "0";
      if ((Node->type).value != 0.0) {
        pcVar7 = "1";
      }
      if (NAN((Node->type).value)) {
        pcVar7 = "1";
      }
      fprintf(pFVar3," %s\n",pcVar7);
    }
    pcVar7 = local_40[Node->index];
    if (pcVar7 == (char *)0x0) break;
    pDVar1 = (Node->type).kids.T;
    pDVar2 = (Node->type).kids.E;
    if (pDVar2 == (DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe)) {
      fprintf(local_60,".names %s %s%lx %s%lx %s%lx\n",pcVar7,local_58,
              ((ulong)pDVar2 & (ulong)visited) / 0x28,local_58,
              ((ulong)pDVar1 & (ulong)visited) / 0x28,local_58,((ulong)Node & (ulong)visited) / 0x28
             );
      fwrite("01- 1\n",6,1,pFVar3);
      fwrite("1-1 1\n",6,1,pFVar3);
    }
    else {
      uVar8 = ((ulong)pDVar2 & (ulong)visited) / 0x28;
      fprintf(local_60,".names %s %s%lx_i %s%lx %s%lx\n",pcVar7,local_58,uVar8,local_58,
              ((ulong)pDVar1 & (ulong)visited) / 0x28,local_58,((ulong)Node & (ulong)visited) / 0x28
             );
      fwrite("01- 1\n",6,1,pFVar3);
      fwrite("1-1 1\n",6,1,pFVar3);
      iVar4 = st__find(local_48,(char *)((ulong)pDVar2 & 0xfffffffffffffffe),(char ***)&pSlot);
      pFVar3 = local_60;
      if (iVar4 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casCore.c"
                      ,0x38c,"void WriteDDintoBLIFfile(FILE *, DdNode *, char *, char *, char **)");
      }
      psVar5 = local_50;
      if (*pSlot == 0) {
        *pSlot = 1;
        fprintf(local_60,".names %s%lx %s%lx_i\n",local_58,uVar8,local_58,uVar8);
        fwrite("0 1\n",4,1,pFVar3);
        psVar5 = local_50;
      }
    }
  }
  __assert_fail("InputNames[Node->index]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casCore.c"
                ,0x376,"void WriteDDintoBLIFfile(FILE *, DdNode *, char *, char *, char **)");
}

Assistant:

void WriteDDintoBLIFfile( FILE * pFile, DdNode * Func, char * OutputName, char * Prefix, char ** InputNames )
// writes the main part of the BLIF file 
// Func is a BDD or a 0-1 ADD to be written
// OutputName is the name of the output
// Prefix is attached to each intermendiate signal to make it unique
// InputNames are the names of the input signals
// (some part of the code is borrowed from Cudd_DumpDot())
{
    int i;
    st__table * visited;
    st__generator * gen = NULL;
    long refAddr, diff, mask;
    DdNode * Node, * Else, * ElseR, * Then;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash );

    /* Collect all the nodes of this DD in the symbol table. */
    cuddCollectNodes( Cudd_Regular(Func), visited );

    /* Find how many most significant hex digits are identical
       ** in the addresses of all the nodes. Build a mask based
       ** on this knowledge, so that digits that carry no information
       ** will not be printed. This is done in two steps.
       **  1. We scan the symbol table to find the bits that differ
       **     in at least 2 addresses.
       **  2. We choose one of the possible masks. There are 8 possible
       **     masks for 32-bit integer, and 16 possible masks for 64-bit
       **     integers.
     */

    /* Find the bits that are different. */
    refAddr = ( long )Cudd_Regular(Func);
    diff = 0;
    gen = st__init_gen( visited );
    while ( st__gen( gen, ( const char ** ) &Node, NULL ) )
    {
        diff |= refAddr ^ ( long ) Node;
    }
    st__free_gen( gen );
    gen = NULL;

    /* Choose the mask. */
    for ( i = 0; ( unsigned ) i < 8 * sizeof( long ); i += 4 )
    {
        mask = ( 1 << i ) - 1;
        if ( diff <= mask )
            break;
    }


    // write the buffer for the output
    fprintf( pFile, ".names %s%lx %s\n", Prefix, ( mask & (long)Cudd_Regular(Func) ) / sizeof(DdNode), OutputName ); 
    fprintf( pFile, "%s 1\n", (Cudd_IsComplement(Func))? "0": "1" );


    gen = st__init_gen( visited );
    while ( st__gen( gen, ( const char ** ) &Node, NULL ) )
    {
        if ( Node->index == CUDD_MAXINDEX )
        {
            // write the terminal node
            fprintf( pFile, ".names %s%lx\n", Prefix, ( mask & (long)Node ) / sizeof(DdNode) );
            fprintf( pFile, " %s\n", (cuddV(Node) == 0.0)? "0": "1" );
            continue;
        }

        Else  = cuddE(Node);
        ElseR = Cudd_Regular(Else);
        Then  = cuddT(Node);

        assert( InputNames[Node->index] );
        if ( Else == ElseR )
        { // no inverter
            fprintf( pFile, ".names %s %s%lx %s%lx %s%lx\n", InputNames[Node->index],                           
                              Prefix, ( mask & (long)ElseR ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Then  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Node  ) / sizeof(DdNode)   );
            fprintf( pFile, "01- 1\n" );
            fprintf( pFile, "1-1 1\n" );
        }
        else
        { // inverter
            int * pSlot;
            fprintf( pFile, ".names %s %s%lx_i %s%lx %s%lx\n", InputNames[Node->index],                         
                              Prefix, ( mask & (long)ElseR ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Then  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Node  ) / sizeof(DdNode)   );
            fprintf( pFile, "01- 1\n" );
            fprintf( pFile, "1-1 1\n" );

            // if the inverter is written, skip
            if ( ! st__find( visited, (char *)ElseR, (char ***)&pSlot ) )
                assert( 0 );
            if ( *pSlot )
                continue;
            *pSlot = 1;

            fprintf( pFile, ".names %s%lx %s%lx_i\n",  
                              Prefix, ( mask & (long)ElseR  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)ElseR  ) / sizeof(DdNode)   );
            fprintf( pFile, "0 1\n" );
        }
    }
    st__free_gen( gen );
    gen = NULL;
    st__free_table( visited );
}